

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRC_Core.cpp
# Opt level: O0

bool __thiscall IRCCorePlugin::initialize(IRCCorePlugin *this)

{
  bool bVar1;
  reference pbVar2;
  basic_string_view<char,_std::char_traits<char>_> bVar3;
  undefined1 auVar4 [16];
  basic_string_view<char,_std::char_traits<char>_> *entry;
  iterator __end2;
  iterator __begin2;
  container_type *__range2;
  undefined1 local_58 [8];
  container_type server_entries;
  undefined8 local_38;
  size_t local_30;
  char *local_28;
  undefined1 local_20 [8];
  string_view serverList;
  IRCCorePlugin *this_local;
  
  serverList._M_str = (char *)this;
  bVar3 = sv("Servers",7);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             &server_entries.
              super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_30 = bVar3._M_len;
  local_28 = bVar3._M_str;
  auVar4 = Jupiter::Config::get
                     (&this->field_0x38,local_30,local_28,
                      server_entries.
                      super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,local_38);
  serverList._M_len = auVar4._8_8_;
  local_20 = auVar4._0_8_;
  bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  if (!bVar1) {
    ServerManager::setConfig(_serverManager,(Config *)&this->field_0x38);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2," \t");
    jessilib::
    word_split_view<std::vector,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
              ((container_type *)local_58,
               (basic_string_view<char,_std::char_traits<char>_> *)local_20,
               (basic_string_view<char,_std::char_traits<char>_> *)&__range2);
    __end2 = std::
             vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ::begin((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                      *)local_58);
    entry = (basic_string_view<char,_std::char_traits<char>_> *)
            std::
            vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
            ::end((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
                   *)local_58);
    while( true ) {
      bVar1 = __gnu_cxx::
              operator==<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                        (&__end2,(__normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                  *)&entry);
      if (((bVar1 ^ 0xffU) & 1) == 0) break;
      pbVar2 = __gnu_cxx::
               __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
               ::operator*(&__end2);
      ServerManager::addServer(_serverManager,pbVar2->_M_len,pbVar2->_M_str);
      __gnu_cxx::
      __normal_iterator<std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::operator++(&__end2);
    }
    std::
    vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
    ::~vector((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)local_58);
  }
  return true;
}

Assistant:

bool IRCCorePlugin::initialize() {
	// TODO: initialize() isn't bringing in generic commands from already-loaded plugins
	std::string_view serverList = this->config.get("Servers"sv);
	if (!serverList.empty()) {
		serverManager->setConfig(this->config);

		auto server_entries = jessilib::word_split_view(serverList, WHITESPACE_SV);
		for (const auto& entry : server_entries) {
			serverManager->addServer(entry);
		}
	}

	return true;
}